

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::getPrefixMultiplier2Char(char c1,char c2)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  pair<unsigned_short,_double> *ppVar3;
  double local_38;
  pair<unsigned_short,_double> local_30;
  pair<unsigned_short,_double> *local_20;
  pair<unsigned_short,_double> *fnd;
  uint16_t code;
  char c2_local;
  double dStack_10;
  char c1_local;
  
  fnd._6_1_ = c2;
  fnd._7_1_ = c1;
  fnd._4_2_ = charindex(c1,c2);
  pvVar1 = std::array<std::pair<unsigned_short,_double>,_25UL>::begin
                     (&getPrefixMultiplier2Char::char2prefix);
  pvVar2 = std::array<std::pair<unsigned_short,_double>,_25UL>::end
                     (&getPrefixMultiplier2Char::char2prefix);
  local_38 = 0.0;
  std::pair<unsigned_short,_double>::pair<unsigned_short_&,_double,_true>
            (&local_30,(unsigned_short *)((long)&fnd + 4),&local_38);
  ppVar3 = std::
           lower_bound<std::pair<unsigned_short,double>const*,std::pair<unsigned_short,double>,units::getPrefixMultiplier2Char(char,char)::__0>
                     (pvVar1,pvVar2,&local_30);
  local_20 = ppVar3;
  pvVar1 = std::array<std::pair<unsigned_short,_double>,_25UL>::end
                     (&getPrefixMultiplier2Char::char2prefix);
  if ((ppVar3 == pvVar1) || (local_20->first != fnd._4_2_)) {
    dStack_10 = 0.0;
  }
  else {
    dStack_10 = local_20->second;
  }
  return dStack_10;
}

Assistant:

static double getPrefixMultiplier2Char(char c1, char c2)
{
    using cpair = std::pair<uint16_t, double>;
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<cpair, 25> char2prefix{{
        cpair{charindex('D', 'A'), precise::deka.multiplier()},
        cpair{charindex('E', 'X'), precise::exa.multiplier()},
        cpair{charindex('E', 'i'), precise::exbi.multiplier()},
        cpair{charindex('G', 'A'), precise::giga.multiplier()},
        cpair{charindex('G', 'i'), precise::gibi.multiplier()},
        cpair{charindex('K', 'i'), precise::kibi.multiplier()},
        cpair{charindex('M', 'A'), precise::mega.multiplier()},
        cpair{charindex('M', 'M'), precise::mega.multiplier()},
        cpair{charindex('M', 'i'), precise::mebi.multiplier()},
        cpair{charindex('P', 'T'), precise::peta.multiplier()},
        cpair{charindex('P', 'i'), precise::pebi.multiplier()},
        cpair{charindex('T', 'R'), precise::tera.multiplier()},
        cpair{charindex('T', 'i'), precise::tebi.multiplier()},
        cpair{charindex('Y', 'A'), precise::yotta.multiplier()},
        cpair{charindex('Y', 'O'), precise::yocto.multiplier()},
        cpair{charindex('Y', 'i'), precise::yobi.multiplier()},
        cpair{charindex('R', 'i'), precise::robi.multiplier()},
        cpair{charindex('Q', 'i'), precise::qubi.multiplier()},
        cpair{charindex('Z', 'A'), precise::zetta.multiplier()},
        cpair{charindex('Z', 'O'), precise::zepto.multiplier()},
        cpair{charindex('Z', 'i'), precise::zebi.multiplier()},
        cpair{charindex('d', 'a'), precise::deka.multiplier()},
        cpair{charindex('m', 'A'), precise::mega.multiplier()},
        cpair{charindex('m', 'c'), precise::micro.multiplier()},
        cpair{charindex('p', 'T'), precise::peta.multiplier()},
    }};
    auto code = charindex(c1, c2);
    // NOLINTNEXTLINE (readability-qualified-auto)
    const auto fnd = std::lower_bound(
        char2prefix.begin(),
        char2prefix.end(),
        cpair{code, 0.0},
        [](const cpair& p, const cpair& test) {
            return (p.first < test.first);
        });

    if (fnd != char2prefix.end() && fnd->first == code) {
        return fnd->second;
    }
    return 0.0;
}